

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void google::protobuf::compiler::cpp::anon_unknown_0::DebugAssertUniformLikelyPresence
               (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *fields,Options *options)

{
  anon_class_8_1_38e0b97e local_20;
  Options *local_18;
  Options *options_local;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields_local;
  
  local_20.options = options;
  local_18 = options;
  options_local = (Options *)fields;
  cpp::(anonymous_namespace)::
  DebugAssertUniform<google::protobuf::compiler::cpp::(anonymous_namespace)::DebugAssertUniformLikelyPresence(std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>const&,google::protobuf::compiler::cpp::Options_const&)::__0>
            (fields,options,&local_20);
  return;
}

Assistant:

void DebugAssertUniformLikelyPresence(
    const std::vector<const FieldDescriptor*>& fields, const Options& options) {
  DebugAssertUniform(fields, options, [&](const FieldDescriptor* f) {
    return IsLikelyPresent(f, options);
  });
}